

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v8::detail::utf8_decode(char *s,uint32_t *c,int *e)

{
  int iVar1;
  char *next;
  undefined8 uStack_98;
  int len;
  int shifte [5];
  int shiftc [5];
  uint32_t mins [5];
  int masks [5];
  int *e_local;
  uint32_t *c_local;
  char *s_local;
  
  masks[0] = 0x1f;
  masks[1] = 0xf;
  masks[2] = 7;
  mins[0] = 0x80;
  mins[1] = 0x800;
  mins[2] = 0x10000;
  shiftc[0] = 0xc;
  shiftc[1] = 6;
  shiftc[2] = 0;
  uStack_98 = 0x600000000;
  shifte[0] = 4;
  shifte[1] = 2;
  shifte[2] = 0;
  unique0x100000fd = (uint *)e;
  iVar1 = code_point_length<char>(s);
  *c = ((int)*s & masks[(long)iVar1 + -2]) << 0x12;
  *c = ((int)s[1] & 0x3fU) << 0xc | *c;
  *c = ((int)s[2] & 0x3fU) << 6 | *c;
  *c = (int)s[3] & 0x3fU | *c;
  *c = *c >> ((byte)shiftc[(long)iVar1 + -2] & 0x1f);
  *stack0xffffffffffffffe0 = (uint)(*c < mins[(long)iVar1 + -2]) << 6;
  *stack0xffffffffffffffe0 = (uint)(*c >> 0xb == 0x1b) << 7 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = (uint)(0x10ffff < *c) << 8 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = (int)((byte)s[1] & 0xc0) >> 2 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = (int)((byte)s[2] & 0xc0) >> 4 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = (int)(uint)(byte)s[3] >> 6 | *stack0xffffffffffffffe0;
  *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 ^ 0x2a;
  *stack0xffffffffffffffe0 =
       (int)*stack0xffffffffffffffe0 >>
       ((byte)*(undefined4 *)((long)&stack0xffffffffffffff68 + (long)iVar1 * 4) & 0x1f);
  return s + iVar1;
}

Assistant:

FMT_CONSTEXPR inline auto utf8_decode(const char* s, uint32_t* c, int* e)
    -> const char* {
  constexpr const int masks[] = {0x00, 0x7f, 0x1f, 0x0f, 0x07};
  constexpr const uint32_t mins[] = {4194304, 0, 128, 2048, 65536};
  constexpr const int shiftc[] = {0, 18, 12, 6, 0};
  constexpr const int shifte[] = {0, 6, 4, 2, 0};

  int len = code_point_length(s);
  const char* next = s + len;

  // Assume a four-byte character and load four bytes. Unused bits are
  // shifted out.
  *c = uint32_t(s[0] & masks[len]) << 18;
  *c |= uint32_t(s[1] & 0x3f) << 12;
  *c |= uint32_t(s[2] & 0x3f) << 6;
  *c |= uint32_t(s[3] & 0x3f) << 0;
  *c >>= shiftc[len];

  // Accumulate the various error conditions.
  using uchar = unsigned char;
  *e = (*c < mins[len]) << 6;       // non-canonical encoding
  *e |= ((*c >> 11) == 0x1b) << 7;  // surrogate half?
  *e |= (*c > 0x10FFFF) << 8;       // out of range?
  *e |= (uchar(s[1]) & 0xc0) >> 2;
  *e |= (uchar(s[2]) & 0xc0) >> 4;
  *e |= uchar(s[3]) >> 6;
  *e ^= 0x2a;  // top two bits of each tail byte correct?
  *e >>= shifte[len];

  return next;
}